

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.hpp
# Opt level: O0

void __thiscall
TasGrid::CustomTabulated::CustomTabulated<TasGrid::IO::mode_binary_type>
          (CustomTabulated *this,istream *is)

{
  istream *is_local;
  CustomTabulated *this_local;
  
  CustomTabulated(this);
  read<true>(this,is);
  return;
}

Assistant:

CustomTabulated(std::istream &is, iomode) : CustomTabulated(){
        if (std::is_same<iomode, IO::mode_ascii_type>::value)
            read<mode_ascii>(is); else read<mode_binary>(is);
    }